

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  int64 iVar5;
  ulong uVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  uint32 tag;
  uint uVar10;
  uint uVar11;
  uint32 first_byte_or_zero;
  uint uVar12;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    uVar10 = (uint)*pbVar2;
    if (-1 < (char)*pbVar2) {
      input->buffer_ = pbVar2 + 1;
      goto LAB_0032174e;
    }
  }
  else {
    uVar10 = 0;
  }
  iVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
  uVar10 = (uint)iVar5;
  if (iVar5 < 0) {
    return false;
  }
LAB_0032174e:
  limit = io::CodedInputStream::PushLimit(input,uVar10);
  iVar4 = io::CodedInputStream::BytesUntilLimit(input);
  if (0 < iVar4) {
    uVar10 = field_number << 3;
    do {
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar6 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0032178a;
        input->buffer_ = pbVar2 + 1;
      }
      else {
        first_byte_or_zero = 0;
LAB_0032178a:
        uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        if ((long)uVar6 < 0) {
          return false;
        }
      }
      uVar12 = (uint)uVar6;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar3 = (*is_valid)(uVar12), bVar3)) {
        iVar4 = values->current_size_;
        if (iVar4 == values->total_size_) {
          RepeatedField<int>::Reserve(values,iVar4 + 1);
          iVar4 = values->current_size_;
        }
        values->current_size_ = iVar4 + 1;
        values->rep_->elements[iVar4] = uVar12;
      }
      else {
        if (unknown_fields_stream->buffer_size_ < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(unknown_fields_stream,uVar10);
          iVar4 = unknown_fields_stream->buffer_size_;
        }
        else {
          pbVar2 = unknown_fields_stream->buffer_;
          pbVar7 = pbVar2;
          uVar8 = uVar10;
          uVar11 = uVar10;
          if (0x7f < uVar10) {
            do {
              *pbVar7 = (byte)uVar11 | 0x80;
              uVar8 = uVar11 >> 7;
              pbVar7 = pbVar7 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar8;
            } while (bVar3);
          }
          *pbVar7 = (byte)uVar8;
          iVar4 = ((int)pbVar7 - (int)pbVar2) + 1;
          unknown_fields_stream->buffer_ = unknown_fields_stream->buffer_ + iVar4;
          iVar4 = unknown_fields_stream->buffer_size_ - iVar4;
          unknown_fields_stream->buffer_size_ = iVar4;
        }
        if (iVar4 < 5) {
          io::CodedOutputStream::WriteVarint32SlowPath(unknown_fields_stream,uVar12);
        }
        else {
          pbVar2 = unknown_fields_stream->buffer_;
          pbVar7 = pbVar2;
          if (uVar12 < 0x80) {
            uVar9 = uVar6 & 0xffffffff;
          }
          else {
            uVar9 = uVar6 & 0xffffffff;
            do {
              uVar12 = (uint)uVar6;
              *pbVar7 = (byte)uVar6 | 0x80;
              uVar9 = uVar9 >> 7;
              pbVar7 = pbVar7 + 1;
              uVar6 = uVar9;
            } while (0x3fff < uVar12);
          }
          *pbVar7 = (byte)uVar9;
          iVar4 = ((int)pbVar7 - (int)pbVar2) + 1;
          unknown_fields_stream->buffer_ = unknown_fields_stream->buffer_ + iVar4;
          unknown_fields_stream->buffer_size_ = unknown_fields_stream->buffer_size_ - iVar4;
        }
      }
      iVar4 = io::CodedInputStream::BytesUntilLimit(input);
    } while (0 < iVar4);
  }
  io::CodedInputStream::PopLimit(input,limit);
  return true;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input,
    int field_number,
    bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream,
    RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}